

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void * __thiscall pbrt::ScratchBuffer::Alloc(ScratchBuffer *this,size_t size,size_t align)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  int iVar4;
  int vb;
  size_t va;
  
  iVar4 = this->offset;
  uVar3 = (ulong)iVar4;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = align;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  if (SUB168(auVar2 % auVar1,0) != 0) {
    iVar4 = iVar4 + ((int)align - SUB164(auVar2 % auVar1,0));
    uVar3 = (ulong)iVar4;
    this->offset = iVar4;
  }
  va = uVar3 + size;
  vb = this->allocatedBytes;
  if (va <= (ulong)(long)vb) {
    this->offset = iVar4 + (int)size;
    return this->ptr + uVar3;
  }
  LogFatal<char_const(&)[14],char_const(&)[15],char_const(&)[14],unsigned_long&,char_const(&)[15],int&>
            (Fatal,
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/memory.h"
             ,0xa4,"Check failed: %s <= %s with %s = %s, %s = %s",(char (*) [14])"offset + size",
             (char (*) [15])"allocatedBytes",(char (*) [14])"offset + size",&va,
             (char (*) [15])"allocatedBytes",&vb);
}

Assistant:

PBRT_CPU_GPU
    void *Alloc(size_t size, size_t align) {
        if ((offset % align) != 0)
            offset += align - (offset % align);
        CHECK_LE(offset + size, allocatedBytes);

        void *p = ptr + offset;
        offset += size;
        return p;
    }